

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_engine.cpp
# Opt level: O3

void __thiscall zmq::raw_engine_t::error(raw_engine_t *this,error_reason_t reason_)

{
  code *pcVar1;
  int __fd;
  undefined4 in_register_00000034;
  msg_t terminator;
  msg_t mStack_58;
  
  __fd = (int)&mStack_58;
  if (((this->super_stream_engine_base_t)._options.raw_socket == true) &&
     ((this->super_stream_engine_base_t)._options.raw_notify == true)) {
    msg_t::init(&mStack_58,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,reason_));
    pcVar1 = (code *)(this->super_stream_engine_base_t)._process_msg;
    if (((ulong)pcVar1 & 1) != 0) {
      pcVar1 = *(code **)(pcVar1 + *(long *)((this->super_stream_engine_base_t)._options.routing_id
                                            + *(long *)&(this->super_stream_engine_base_t).
                                                        field_0x560 + -0x29) + -1);
    }
    (*pcVar1)();
    msg_t::close(&mStack_58,__fd);
  }
  stream_engine_base_t::error(&this->super_stream_engine_base_t,reason_);
  return;
}

Assistant:

void zmq::raw_engine_t::error (error_reason_t reason_)
{
    if (_options.raw_socket && _options.raw_notify) {
        //  For raw sockets, send a final 0-length message to the application
        //  so that it knows the peer has been disconnected.
        msg_t terminator;
        terminator.init ();
        (this->*_process_msg) (&terminator);
        terminator.close ();
    }
    stream_engine_base_t::error (reason_);
}